

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Optimisations.h
# Opt level: O3

Variable * __thiscall soul::Optimisations::Inliner::getRemappedVariable(Inliner *this,Variable *old)

{
  Module *pMVar1;
  string *psVar2;
  Allocator *pAVar3;
  pointer pcVar4;
  string *psVar5;
  mapped_type *pmVar6;
  long *plVar7;
  Variable *pVVar8;
  ulong uVar9;
  undefined8 uVar10;
  string_view newString;
  key_type local_b8;
  size_t local_b0;
  _func_int **local_a8;
  Ptr PStack_a0;
  UTF8Reader local_98;
  long local_90;
  ulong local_88 [2];
  string local_78;
  string local_58;
  Identifier local_38;
  
  if (2 < old->role - mutableLocal) {
    return old;
  }
  local_b8.object = old;
  pmVar6 = std::__detail::
           _Map_base<soul::pool_ref<soul::heart::Variable>,_std::pair<const_soul::pool_ref<soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>_>,_std::allocator<std::pair<const_soul::pool_ref<soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<soul::heart::Variable>_>,_std::hash<soul::pool_ref<soul::heart::Variable>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<soul::pool_ref<soul::heart::Variable>,_std::pair<const_soul::pool_ref<soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>_>,_std::allocator<std::pair<const_soul::pool_ref<soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<soul::heart::Variable>_>,_std::hash<soul::pool_ref<soul::heart::Variable>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->remappedVariables,&local_b8);
  if (pmVar6->object != (Variable *)0x0) {
    return pmVar6->object;
  }
  pMVar1 = this->module;
  psVar2 = (old->name).name;
  if (psVar2 == (string *)0x0) {
    local_38.name = (string *)0x0;
    goto LAB_00271636;
  }
  pAVar3 = pMVar1->allocator;
  local_98.data = (char *)local_88;
  pcVar4 = (this->inlinedFnName)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar4,pcVar4 + (this->inlinedFnName)._M_string_length);
  std::__cxx11::string::append((char *)&local_98);
  psVar5 = (old->name).name;
  if (psVar5 == (string *)0x0) {
    throwInternalCompilerError("isValid()","operator const std::basic_string<char> &",0x21);
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  pcVar4 = (psVar5->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar4,pcVar4 + psVar5->_M_string_length);
  makeSafeIdentifierName(&local_78,&local_58);
  uVar9 = 0xf;
  if ((ulong *)local_98.data != local_88) {
    uVar9 = local_88[0];
  }
  if (uVar9 < local_78._M_string_length + local_90) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      uVar10 = local_78.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar10 < local_78._M_string_length + local_90) goto LAB_002715b5;
    plVar7 = (long *)std::__cxx11::string::replace
                               ((ulong)&local_78,0,(char *)0x0,(ulong)local_98.data);
  }
  else {
LAB_002715b5:
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_98,(ulong)local_78._M_dataplus._M_p);
  }
  local_b8.object = (Variable *)&local_a8;
  pVVar8 = (Variable *)(plVar7 + 2);
  if ((Variable *)*plVar7 == pVVar8) {
    local_a8 = (pVVar8->super_Expression).super_Object._vptr_Object;
    PStack_a0.object = (SourceCodeText *)plVar7[3];
  }
  else {
    local_a8 = (pVVar8->super_Expression).super_Object._vptr_Object;
    local_b8.object = (Variable *)*plVar7;
  }
  local_b0 = plVar7[1];
  *plVar7 = (long)pVVar8;
  plVar7[1] = 0;
  *(undefined1 *)&(pVVar8->super_Expression).super_Object._vptr_Object = 0;
  newString._M_str = (char *)local_b8.object;
  newString._M_len = local_b0;
  local_38 = Identifier::Pool::get(&pAVar3->identifiers,newString);
LAB_00271636:
  pVVar8 = PoolAllocator::
           allocate<soul::heart::Variable,soul::CodeLocation&,soul::Type&,soul::Identifier,soul::heart::Variable::Role&>
                     (&pMVar1->allocator->pool,&(old->super_Expression).super_Object.location,
                      &old->type,&local_38,&old->role);
  pmVar6->object = pVVar8;
  if (psVar2 != (string *)0x0) {
    if (local_b8.object != (Variable *)&local_a8) {
      operator_delete(local_b8.object,(long)local_a8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if ((ulong *)local_98.data != local_88) {
      operator_delete(local_98.data,local_88[0] + 1);
    }
    pVVar8 = pmVar6->object;
    if (pVVar8 == (Variable *)0x0) {
      throwInternalCompilerError("object != nullptr","operator->",0x3c);
    }
  }
  Annotation::operator=(&pVVar8->annotation,&old->annotation);
  if (pmVar6->object != (Variable *)0x0) {
    return pmVar6->object;
  }
  throwInternalCompilerError("object != nullptr","operator*",0x3b);
}

Assistant:

heart::Variable& getRemappedVariable (heart::Variable& old)
        {
            if (old.isFunctionLocal() || old.isParameter())
            {
                auto& v = remappedVariables[old];

                if (v == nullptr)
                {
                    v = module.allocate<heart::Variable> (old.location, old.type,
                                                          old.name.isValid() ? module.allocator.get (inlinedFnName + "_" + makeSafeIdentifierName (old.name))
                                                                             : Identifier(),
                                                          old.role);
                    v->annotation = old.annotation;
                }

                return *v;
            }

            return old;
        }